

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O1

SharedPtr<Decorator> __thiscall
Rml::DecoratorConicGradientInstancer::InstanceDecorator
          (DecoratorConicGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  Array<const_Property_*,_2> p_position;
  DecoratorConicGradient *pDVar1;
  int iVar2;
  Property *this_00;
  Property *pPVar3;
  Property *pPVar4;
  Property *pPVar5;
  NumericValue value;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  float fVar7;
  Vector2Numeric VVar8;
  SharedPtr<Decorator> SVar9;
  SharedPtr<Rml::DecoratorConicGradient> decorator;
  undefined1 local_51;
  DecoratorConicGradient *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined4 in_stack_ffffffffffffffc0;
  
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  pPVar3 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  pPVar4 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  pPVar5 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  _Var6._M_pi = extraout_RDX;
  if ((pPVar3 != (Property *)0x0 && this_00 != (Property *)0x0) &&
     (pPVar4 != (Property *)0x0 && pPVar5 != (Property *)0x0)) {
    value = Property::GetNumericValue(this_00);
    fVar7 = ComputeAngle(value);
    p_position._M_elems[0]._4_4_ = fVar7;
    p_position._M_elems[0]._0_4_ = in_stack_ffffffffffffffc0;
    p_position._M_elems[1] = (Property *)properties_;
    VVar8 = ComputePosition(p_position);
    iVar2 = ::std::__cxx11::string::compare((char *)properties_);
    _Var6._M_pi = extraout_RDX_00;
    if (pPVar5->unit == COLORSTOPLIST) {
      local_50 = (DecoratorConicGradient *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Rml::DecoratorConicGradient,std::allocator<Rml::DecoratorConicGradient>>
                (&local_48,&local_50,(allocator<Rml::DecoratorConicGradient> *)&local_51);
      pDVar1 = local_50;
      local_50->repeating = iVar2 == 0;
      local_50->angle = fVar7;
      local_50->position = VVar8;
      ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::operator=
                (&local_50->color_stops,
                 (vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)(pPVar5->value).data);
      _Var6._M_pi = local_48._M_pi;
      if ((pDVar1->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (pDVar1->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
        (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
      else {
        (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)local_50;
        (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var6._M_pi;
        local_50 = (DecoratorConicGradient *)0x0;
      }
      _Var6._M_pi = extraout_RDX_01;
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
        _Var6._M_pi = extraout_RDX_02;
      }
      goto LAB_0020d1cf;
    }
  }
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
  (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_0020d1cf:
  SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorConicGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_angle = properties_.GetProperty(ids.angle);
	Array<const Property*, 2> p_position = {properties_.GetProperty(ids.position_x), properties_.GetProperty(ids.position_y)};
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_angle || !p_position[0] || !p_position[1] || !p_color_stop_list)
		return nullptr;

	const float angle = ComputeAngle(p_angle->GetNumericValue());
	const Vector2Numeric position = ComputePosition(p_position);
	const bool repeating = (name == "repeating-conic-gradient");

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();

	auto decorator = MakeShared<DecoratorConicGradient>();
	if (decorator->Initialise(repeating, angle, position, color_stop_list))
		return decorator;

	return nullptr;
}